

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  ushort uVar1;
  stbi__uint16 sVar2;
  stbi__uint16 *psVar3;
  uint uVar4;
  int iVar5;
  ushort *puVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  ushort *puVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      __assert_fail("req_comp >= 1 && req_comp <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pranjalpokharel7[P]our-rocket/src/../include/stb_image.h"
                    ,0x6dd,
                    "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                   );
    }
    psVar3 = (stbi__uint16 *)malloc((ulong)(req_comp * x * y * 2));
    if (psVar3 == (stbi__uint16 *)0x0) {
      free(data);
      *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
      data = (stbi__uint16 *)0x0;
    }
    else {
      iVar7 = req_comp + img_n * 8;
      uVar4 = 0;
      if ((int)y < 1) {
        y = 0;
      }
      iVar5 = x - 1;
      uVar11 = 0;
      for (uVar12 = 0; uVar12 != y; uVar12 = uVar12 + 1) {
        if (0x19 < iVar7 - 10U) {
switchD_00115853_caseD_d:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/pranjalpokharel7[P]our-rocket/src/../include/stb_image.h"
                        ,0x6fa,
                        "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                       );
        }
        uVar13 = (ulong)uVar4;
        iVar9 = (int)uVar12 * x;
        puVar10 = data + (uint)(iVar9 * img_n);
        puVar6 = psVar3 + (uint)(iVar9 * req_comp);
        switch(iVar7) {
        case 10:
          lVar8 = 0;
          for (iVar9 = iVar5; -1 < iVar9; iVar9 = iVar9 + -1) {
            psVar3[uVar13 + lVar8] = *(stbi__uint16 *)((long)data + lVar8 + uVar11 * 2);
            psVar3[uVar13 + lVar8 + 1] = 0xffff;
            lVar8 = lVar8 + 2;
          }
          break;
        case 0xb:
          puVar6 = psVar3 + uVar13 + 2;
          for (iVar9 = iVar5; -1 < iVar9; iVar9 = iVar9 + -1) {
            uVar1 = *puVar10;
            *puVar6 = uVar1;
            puVar6[-1] = uVar1;
            puVar6[-2] = uVar1;
            puVar10 = puVar10 + 1;
            puVar6 = puVar6 + 3;
          }
          break;
        case 0xc:
          lVar8 = 0;
          for (iVar9 = iVar5; -1 < iVar9; iVar9 = iVar9 + -1) {
            sVar2 = *(stbi__uint16 *)((long)data + lVar8 + uVar11 * 2);
            psVar3[uVar13 + lVar8 * 2 + 2] = sVar2;
            psVar3[uVar13 + lVar8 * 2 + 1] = sVar2;
            psVar3[uVar13 + lVar8 * 2] = sVar2;
            psVar3[uVar13 + lVar8 * 2 + 3] = 0xffff;
            lVar8 = lVar8 + 2;
          }
          break;
        default:
          goto switchD_00115853_caseD_d;
        case 0x11:
          lVar8 = 0;
          for (iVar9 = iVar5; -1 < iVar9; iVar9 = iVar9 + -1) {
            *(stbi__uint16 *)((long)psVar3 + lVar8 + uVar13 * 2) = data[uVar11 + lVar8];
            lVar8 = lVar8 + 2;
          }
          break;
        case 0x13:
          puVar6 = psVar3 + uVar13 + 2;
          for (iVar9 = iVar5; -1 < iVar9; iVar9 = iVar9 + -1) {
            uVar1 = *puVar10;
            *puVar6 = uVar1;
            puVar6[-1] = uVar1;
            puVar6[-2] = uVar1;
            puVar10 = puVar10 + 2;
            puVar6 = puVar6 + 3;
          }
          break;
        case 0x14:
          lVar8 = 0;
          for (iVar9 = iVar5; -1 < iVar9; iVar9 = iVar9 + -1) {
            sVar2 = *(stbi__uint16 *)((long)data + lVar8 + uVar11 * 2);
            psVar3[uVar13 + lVar8 + 2] = sVar2;
            psVar3[uVar13 + lVar8 + 1] = sVar2;
            psVar3[uVar13 + lVar8] = sVar2;
            psVar3[uVar13 + lVar8 + 3] = *(stbi__uint16 *)((long)data + lVar8 + uVar11 * 2 + 2);
            lVar8 = lVar8 + 4;
          }
          break;
        case 0x19:
          for (iVar9 = iVar5; -1 < iVar9; iVar9 = iVar9 + -1) {
            *puVar6 = (ushort)((uint)puVar10[2] * 0x1d +
                               (uint)puVar10[1] * 0x96 + (uint)*puVar10 * 0x4d >> 8);
            puVar10 = puVar10 + 3;
            puVar6 = puVar6 + 1;
          }
          break;
        case 0x1a:
          for (iVar9 = iVar5; -1 < iVar9; iVar9 = iVar9 + -1) {
            *puVar6 = (ushort)((uint)puVar10[2] * 0x1d +
                               (uint)puVar10[1] * 0x96 + (uint)*puVar10 * 0x4d >> 8);
            puVar6[1] = 0xffff;
            puVar10 = puVar10 + 3;
            puVar6 = puVar6 + 2;
          }
          break;
        case 0x1c:
          for (iVar9 = iVar5; -1 < iVar9; iVar9 = iVar9 + -1) {
            *puVar6 = *puVar10;
            puVar6[1] = puVar10[1];
            puVar6[2] = puVar10[2];
            puVar6[3] = 0xffff;
            puVar10 = puVar10 + 3;
            puVar6 = puVar6 + 4;
          }
          break;
        case 0x21:
          lVar8 = 0;
          for (iVar9 = iVar5; -1 < iVar9; iVar9 = iVar9 + -1) {
            *(short *)((long)psVar3 + lVar8 + uVar13 * 2) =
                 (short)((uint)data[uVar11 + lVar8 * 2 + 2] * 0x1d +
                         (uint)data[uVar11 + lVar8 * 2 + 1] * 0x96 +
                         (uint)data[uVar11 + lVar8 * 2] * 0x4d >> 8);
            lVar8 = lVar8 + 2;
          }
          break;
        case 0x22:
          lVar8 = 0;
          for (iVar9 = iVar5; -1 < iVar9; iVar9 = iVar9 + -1) {
            *(short *)((long)psVar3 + lVar8 + uVar13 * 2) =
                 (short)((uint)data[uVar11 + lVar8 + 2] * 0x1d +
                         (uint)data[uVar11 + lVar8 + 1] * 0x96 + (uint)data[uVar11 + lVar8] * 0x4d
                        >> 8);
            *(stbi__uint16 *)((long)psVar3 + lVar8 + uVar13 * 2 + 2) = data[uVar11 + lVar8 + 3];
            lVar8 = lVar8 + 4;
          }
          break;
        case 0x23:
          for (iVar9 = iVar5; -1 < iVar9; iVar9 = iVar9 + -1) {
            *puVar6 = *puVar10;
            puVar6[1] = puVar10[1];
            puVar6[2] = puVar10[2];
            puVar10 = puVar10 + 4;
            puVar6 = puVar6 + 3;
          }
        }
        uVar11 = (ulong)((int)uVar11 + x * img_n);
        uVar4 = uVar4 + req_comp * x;
      }
      free(data);
      data = psVar3;
    }
  }
  return data;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return (stbi__uint16*) stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}